

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O2

SentencePieceTrainer * __thiscall
sentencepiece::SentencePieceTrainer::Train
          (SentencePieceTrainer *this,string_view args,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sentences,string *serialized_model_proto)

{
  string_view args_00;
  undefined **local_20;
  pointer local_18;
  undefined8 uStack_10;
  
  args_00._M_str = (char *)args._M_len;
  local_20 = &PTR__SentenceIterator_0029ac20;
  local_18 = (sentences->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  uStack_10 = (sentences->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  args_00._M_len = (size_t)this;
  Train(args_00,(SentenceIterator *)args._M_str,(string *)&local_20);
  return this;
}

Assistant:

util::Status SentencePieceTrainer::Train(
    absl::string_view args, const std::vector<std::string> &sentences,
    std::string *serialized_model_proto) {
  VectorSentenceIterator iter(sentences);
  return Train(args, &iter, serialized_model_proto);
}